

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_priority.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::set_priority(raft_server *this,int srv_id,int new_priority)

{
  element_type *peVar1;
  element_type *peVar2;
  int *piVar3;
  int iVar4;
  undefined4 extraout_var;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *plVar5;
  _List_node_base *p_Var6;
  undefined1 local_c1;
  ptr<buffer> new_conf_buf;
  ptr<cluster_config> cloned_config;
  ptr<cluster_config> cur_config;
  undefined1 local_70 [8];
  ptr<log_entry> entry;
  ptr<buffer> enc_conf;
  unique_lock<std::recursive_mutex> guard;
  
  std::unique_lock<std::recursive_mutex>::unique_lock(&guard,&this->lock_);
  if (this->id_ == (this->leader_).super___atomic_base<int>._M_i) {
    if ((new_priority == 0) && (this->id_ == srv_id)) {
      broadcast_priority_change(this,srv_id,0);
    }
    get_config((raft_server *)&cur_config);
    if ((this->uncommitted_config_).
        super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 != (element_type *)0x0) {
        iVar4 = (*peVar1->_vptr_logger[7])();
        if (3 < iVar4) {
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar2 = (this->uncommitted_config_).
                   super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&new_conf_buf,"uncommitted config exists at log %lu, prev log %lu",
                     peVar2->log_idx_,peVar2->prev_log_idx_);
          (*peVar1->_vptr_logger[8])
                    (peVar1,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                     ,"set_priority",0x44,&new_conf_buf);
          std::__cxx11::string::~string((string *)&new_conf_buf);
        }
      }
      std::__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&cur_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>,
                 &(this->uncommitted_config_).
                  super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>);
    }
    cluster_config::serialize((cluster_config *)&enc_conf);
    cluster_config::deserialize
              ((cluster_config *)&cloned_config,
               enc_conf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    plVar5 = &(cloned_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->servers_;
    p_Var6 = (_List_node_base *)plVar5;
    while (p_Var6 = (((_List_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                       *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)plVar5) {
      piVar3 = (int *)p_Var6[1]._M_next;
      if (*piVar3 == srv_id) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar1 != (element_type *)0x0) {
          iVar4 = (*peVar1->_vptr_logger[7])();
          if (3 < iVar4) {
            peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      ((string *)&new_conf_buf,"Change server %d priority %d -> %d",
                       (ulong)(uint)srv_id,(ulong)(uint)piVar3[0x13]);
            (*peVar1->_vptr_logger[8])
                      (peVar1,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                       ,"set_priority",0x51,(string *)&new_conf_buf);
            std::__cxx11::string::~string((string *)&new_conf_buf);
          }
        }
        piVar3[0x13] = new_priority;
      }
    }
    iVar4 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_log_store[2])();
    (cloned_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    prev_log_idx_ =
         (cloned_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->log_idx_;
    (cloned_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    log_idx_ = CONCAT44(extraout_var,iVar4);
    cluster_config::serialize((cluster_config *)&new_conf_buf);
    local_70 = (undefined1  [8])
               (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
    local_c1 = 2;
    timer_helper::get_timeofday_us();
    std::
    make_shared<nuraft::log_entry,unsigned_long,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type,unsigned_long>
              ((unsigned_long *)&entry,(shared_ptr<nuraft::buffer> *)local_70,
               (log_val_type *)&new_conf_buf,(unsigned_long *)&local_c1);
    this->config_changing_ = true;
    std::__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->uncommitted_config_).
                super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>,
               &cloned_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
              );
    store_log_entry(this,&entry,0);
    request_append_entries(this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&entry.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&new_conf_buf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&cloned_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&enc_conf.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&cur_config.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      iVar4 = (*peVar1->_vptr_logger[7])();
      if (3 < iVar4) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&new_conf_buf,
                   "Got set_priority request but I\'m not a leader: my ID %d, leader %d",
                   (ulong)(uint)this->id_,(ulong)(uint)(this->leader_).super___atomic_base<int>._M_i
                  );
        (*peVar1->_vptr_logger[8])
                  (peVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                   ,"set_priority",0x2a,&new_conf_buf);
        std::__cxx11::string::~string((string *)&new_conf_buf);
      }
    }
    if (((this->leader_).super___atomic_base<int>._M_i == -1) ||
       (((this->hb_alive_)._M_base._M_i & 1U) == 0)) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar1 != (element_type *)0x0) {
        iVar4 = (*peVar1->_vptr_logger[7])();
        if (2 < iVar4) {
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&new_conf_buf,"No live leader now, broadcast priority change");
          (*peVar1->_vptr_logger[8])
                    (peVar1,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                     ,"set_priority",0x2d,&new_conf_buf);
          std::__cxx11::string::~string((string *)&new_conf_buf);
        }
      }
      broadcast_priority_change(this,srv_id,new_priority);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&guard);
  return;
}

Assistant:

void raft_server::set_priority(const int srv_id, const int new_priority)
{
    recur_lock(lock_);

    // Do nothing if not a leader.
    if (id_ != leader_) {
        p_in("Got set_priority request but I'm not a leader: my ID %d, leader %d",
             id_, leader_.load());

        if (!is_leader_alive()) {
            p_wn("No live leader now, broadcast priority change");
            broadcast_priority_change(srv_id, new_priority);
        }
        return;
    }

    if (id_ == srv_id && new_priority == 0) {
        // Step down.
        // Even though current leader (myself) can send append_entries()
        // request, it cannot commit the priority change as it will
        // immediately yield its leadership.
        // So in this case, boradcast this change.
        broadcast_priority_change(srv_id, new_priority);
    }

    // Clone current cluster config.
    ptr<cluster_config> cur_config = get_config();

    // NOTE: Need to honor uncommitted config,
    //       refer to comment in `sync_log_to_new_srv()`
    if (uncommitted_config_) {
        p_in("uncommitted config exists at log %" PRIu64 ", prev log %" PRIu64,
             uncommitted_config_->get_log_idx(),
             uncommitted_config_->get_prev_log_idx());
        cur_config = uncommitted_config_;
    }

    ptr<buffer> enc_conf = cur_config->serialize();
    ptr<cluster_config> cloned_config = cluster_config::deserialize(*enc_conf);

    std::list<ptr<srv_config>>& s_confs = cloned_config->get_servers();

    for (auto& entry: s_confs) {
        srv_config* s_conf = entry.get();
        if (s_conf->get_id() == srv_id) {
            p_in("Change server %d priority %d -> %d",
                 srv_id, s_conf->get_priority(), new_priority);
            s_conf->set_priority(new_priority);
        }
    }

    // Create a log for new configuration, it should be replicated.
    cloned_config->set_log_idx(log_store_->next_slot());
    ptr<buffer> new_conf_buf(cloned_config->serialize());
    ptr<log_entry> entry( cs_new<log_entry>
                          ( state_->get_term(),
                            new_conf_buf,
                            log_val_type::conf,
                            timer_helper::get_timeofday_us() ) );

    config_changing_ = true;
    uncommitted_config_ = cloned_config;

    store_log_entry(entry);
    request_append_entries();
}